

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,int field_number,_func_bool_int *is_valid,
               CodedOutputStream *unknown_fields_stream,RepeatedField<int> *values)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  Limit limit;
  int iVar4;
  uint32 first_byte_or_zero;
  int64 iVar5;
  ulong uVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int value;
  ulong unaff_R13;
  bool bVar13;
  
  pbVar7 = input->buffer_;
  if (pbVar7 < input->buffer_end_) {
    uVar12 = (uint)*pbVar7;
    if (-1 < (char)*pbVar7) {
      input->buffer_ = pbVar7 + 1;
      bVar13 = true;
      goto LAB_001df8c2;
    }
  }
  else {
    uVar12 = 0;
  }
  iVar5 = io::CodedInputStream::ReadVarint32Fallback(input,uVar12);
  uVar12 = (uint)iVar5;
  bVar13 = -1 < iVar5;
LAB_001df8c2:
  if (bVar13) {
    limit = io::CodedInputStream::PushLimit(input,uVar12);
    uVar12 = field_number << 3;
    do {
      iVar4 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar4 < 1) {
        io::CodedInputStream::PopLimit(input,limit);
        return true;
      }
      pbVar7 = input->buffer_;
      if (pbVar7 < input->buffer_end_) {
        bVar1 = *pbVar7;
        uVar6 = (ulong)bVar1;
        first_byte_or_zero = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_001df919;
        input->buffer_ = pbVar7 + 1;
        bVar13 = true;
      }
      else {
        first_byte_or_zero = 0;
LAB_001df919:
        uVar6 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        bVar13 = -1 < (long)uVar6;
      }
      uVar2 = unaff_R13;
      if (bVar13) {
        uVar2 = uVar6;
      }
      unaff_R13 = uVar2 & 0xffffffff;
      if (!bVar13) {
        return false;
      }
      uVar10 = (uint)uVar2;
      if ((is_valid == (_func_bool_int *)0x0) || (bVar3 = (*is_valid)(uVar10), bVar3)) {
        uVar11 = values->current_size_;
        if (uVar11 == values->total_size_) {
          RepeatedField<int>::Reserve(values,values->total_size_ + 1);
        }
        *(uint *)((long)values->arena_or_elements_ + (ulong)uVar11 * 4) = uVar10;
        values->current_size_ = uVar11 + 1;
      }
      else {
        pbVar7 = unknown_fields_stream->cur_;
        if ((unknown_fields_stream->impl_).end_ <= pbVar7) {
          pbVar7 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,pbVar7);
        }
        unknown_fields_stream->cur_ = pbVar7;
        if (uVar12 < 0x80) {
          *pbVar7 = (byte)uVar12;
          pbVar7 = pbVar7 + 1;
        }
        else {
          *pbVar7 = (byte)uVar12 | 0x80;
          if (uVar12 < 0x4000) {
            pbVar7[1] = (byte)(uVar12 >> 7);
            pbVar7 = pbVar7 + 2;
          }
          else {
            pbVar7 = pbVar7 + 2;
            uVar11 = uVar12 >> 7;
            do {
              pbVar8 = pbVar7;
              pbVar8[-1] = (byte)uVar11 | 0x80;
              uVar9 = uVar11 >> 7;
              pbVar7 = pbVar8 + 1;
              bVar3 = 0x3fff < uVar11;
              uVar11 = uVar9;
            } while (bVar3);
            *pbVar8 = (byte)uVar9;
          }
        }
        unknown_fields_stream->cur_ = pbVar7;
        if ((unknown_fields_stream->impl_).end_ <= pbVar7) {
          pbVar7 = io::EpsCopyOutputStream::EnsureSpaceFallback
                             (&unknown_fields_stream->impl_,pbVar7);
        }
        unknown_fields_stream->cur_ = pbVar7;
        if (uVar10 < 0x80) {
          *pbVar7 = (byte)unaff_R13;
          pbVar7 = pbVar7 + 1;
        }
        else {
          *pbVar7 = (byte)unaff_R13 | 0x80;
          uVar6 = unaff_R13 >> 7;
          if (uVar10 < 0x4000) {
            pbVar7[1] = (byte)uVar6;
            pbVar7 = pbVar7 + 2;
          }
          else {
            pbVar7 = pbVar7 + 2;
            do {
              pbVar8 = pbVar7;
              uVar10 = (uint)uVar6;
              pbVar8[-1] = (byte)uVar6 | 0x80;
              uVar11 = uVar10 >> 7;
              uVar6 = (ulong)uVar11;
              pbVar7 = pbVar8 + 1;
            } while (0x3fff < uVar10);
            *pbVar8 = (byte)uVar11;
          }
        }
        unknown_fields_stream->cur_ = pbVar7;
      }
    } while (bVar13);
  }
  return false;
}

Assistant:

bool WireFormatLite::ReadPackedEnumPreserveUnknowns(
    io::CodedInputStream* input, int field_number, bool (*is_valid)(int),
    io::CodedOutputStream* unknown_fields_stream, RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    } else {
      uint32 tag = WireFormatLite::MakeTag(field_number,
                                           WireFormatLite::WIRETYPE_VARINT);
      unknown_fields_stream->WriteVarint32(tag);
      unknown_fields_stream->WriteVarint32(value);
    }
  }
  input->PopLimit(limit);
  return true;
}